

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_file.cpp
# Opt level: O0

void __thiscall
foxxll::mmap_file::serve
          (mmap_file *this,void *buffer,offset_type offset,size_type bytes,read_or_write op)

{
  int iVar1;
  void *__dest;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  io_error *piVar7;
  string local_540;
  ostringstream local_520 [8];
  ostringstream msg_2;
  string local_3a0;
  ostringstream local_380 [8];
  ostringstream msg_1;
  string local_200;
  ostringstream local_1e0 [8];
  ostringstream msg;
  void *mem;
  int prot;
  undefined1 local_50 [8];
  scoped_read_write_timer read_write_timer;
  unique_lock<std::mutex> fd_lock;
  read_or_write op_local;
  size_type bytes_local;
  offset_type offset_local;
  void *buffer_local;
  mmap_file *this_local;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&read_write_timer.is_write_,
             &(this->super_ufs_file_base).fd_mutex_);
  file_stats::scoped_read_write_timer::scoped_read_write_timer
            ((scoped_read_write_timer *)local_50,*(file_stats **)&this->field_0x88,bytes,op == WRITE
            );
  iVar1 = 2;
  if (op == READ) {
    iVar1 = 1;
  }
  __dest = mmap64((void *)0x0,bytes,iVar1,1,(this->super_ufs_file_base).file_des_,offset);
  if (__dest == (void *)0xffffffffffffffff) {
    std::__cxx11::ostringstream::ostringstream(local_1e0);
    poVar2 = std::operator<<((ostream *)local_1e0,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2," mmap() failed.");
    poVar2 = std::operator<<(poVar2," path=");
    poVar2 = std::operator<<(poVar2,(string *)&(this->super_ufs_file_base).filename_);
    poVar2 = std::operator<<(poVar2," bytes=");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,bytes);
    poVar2 = std::operator<<(poVar2," Page size: ");
    lVar3 = sysconf(0x1e);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
    poVar2 = std::operator<<(poVar2," offset modulo page size ");
    uVar4 = sysconf(0x1e);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,offset % uVar4);
    poVar2 = std::operator<<(poVar2," : ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar2,pcVar6);
    piVar7 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(piVar7,&local_200);
    __cxa_throw(piVar7,&io_error::typeinfo,io_error::~io_error);
  }
  if (__dest == (void *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_380);
    poVar2 = std::operator<<((ostream *)local_380,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"mmap() returned nullptr");
    poVar2 = std::operator<<(poVar2," : ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar2,pcVar6);
    piVar7 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(piVar7,&local_3a0);
    __cxa_throw(piVar7,&io_error::typeinfo,io_error::~io_error);
  }
  if (op == READ) {
    memcpy(buffer,__dest,bytes);
  }
  else {
    memcpy(__dest,buffer,bytes);
  }
  iVar1 = munmap(__dest,bytes);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_520);
    poVar2 = std::operator<<((ostream *)local_520,"Error in ");
    poVar2 = std::operator<<(poVar2,
                             "virtual void foxxll::mmap_file::serve(void *, offset_type, size_type, request::read_or_write)"
                            );
    poVar2 = std::operator<<(poVar2," : ");
    poVar2 = std::operator<<(poVar2,"munmap() failed");
    poVar2 = std::operator<<(poVar2," : ");
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    std::operator<<(poVar2,pcVar6);
    piVar7 = (io_error *)__cxa_allocate_exception(0x20);
    std::__cxx11::ostringstream::str();
    io_error::io_error(piVar7,&local_540);
    __cxa_throw(piVar7,&io_error::typeinfo,io_error::~io_error);
  }
  file_stats::scoped_read_write_timer::~scoped_read_write_timer((scoped_read_write_timer *)local_50)
  ;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&read_write_timer.is_write_)
  ;
  return;
}

Assistant:

void mmap_file::serve(void* buffer, offset_type offset, size_type bytes,
                      request::read_or_write op)
{
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);

    //assert(offset + bytes <= _size());

    file_stats::scoped_read_write_timer read_write_timer(
        file_stats_, bytes, op == request::WRITE);

    int prot = (op == request::READ) ? PROT_READ : PROT_WRITE;
    void* mem = mmap(nullptr, bytes, prot, MAP_SHARED, file_des_, offset);

    if (mem == MAP_FAILED)
    {
        FOXXLL_THROW_ERRNO(
            io_error,
            " mmap() failed." <<
                " path=" << filename_ <<
                " bytes=" << bytes <<
                " Page size: " << sysconf(_SC_PAGESIZE) <<
                " offset modulo page size " << (offset % sysconf(_SC_PAGESIZE))
        );
    }
    else if (mem == 0)
    {
        FOXXLL_THROW_ERRNO(io_error, "mmap() returned nullptr");
    }
    else
    {
        if (op == request::READ)
        {
            memcpy(buffer, mem, bytes);
        }
        else
        {
            memcpy(mem, buffer, bytes);
        }
        FOXXLL_THROW_ERRNO_NE_0(
            munmap(mem, bytes), io_error,
            "munmap() failed"
        );
    }
}